

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O2

void __thiscall despot::Bridge::PrintAction(Bridge *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = "Call for help";
  if (RIGHT == action) {
    pcVar2 = "Move right";
  }
  pcVar3 = "Move left";
  if (LEFT != action) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Bridge::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		cout << "Move left" << endl;
	} else if (action == RIGHT) {
		cout << "Move right" << endl;
	} else {
		cout << "Call for help" << endl;
	}
}